

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord,ImGuiInputFlags flags,ImGuiID owner_id)

{
  code *pcVar1;
  ImGuiContext *pIVar2;
  undefined1 uVar3;
  bool bVar4;
  ImGuiKey IVar5;
  uint uVar6;
  char *pcVar7;
  ImGuiKeyRoutingData *pIVar8;
  uint in_EDX;
  uint in_ESI;
  ImGuiKeyRoutingData *routing_data;
  int score;
  ImGuiID focus_scope_id;
  ImGuiKey key;
  ImGuiContext *g;
  ImGuiKeyChord in_stack_ffffffffffffffe0;
  ImGuiID focus_scope_id_00;
  ImGuiKey local_1c;
  uint local_c;
  bool local_1;
  
  pIVar2 = GImGui;
  local_c = in_ESI;
  if ((in_ESI & 0x3c00) == 0) {
    local_c = in_ESI | 0xd000;
  }
  IVar5 = FixupKeyChord(0);
  if (pIVar2->DebugBreakInShortcutRouting == IVar5) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return (bool)uVar3;
  }
  if (((local_c & 0x10000) == 0) || (pIVar2->NavWindow != (ImGuiWindow *)0x0)) {
    if ((local_c & 0x2000) == 0) {
      if ((pIVar2->ActiveId != 0) && (pIVar2->ActiveId != in_EDX)) {
        if ((local_c & 0x400) != 0) {
          return false;
        }
        if ((((pIVar2->IO).WantTextInput & 1U) != 0) &&
           (bVar4 = IsKeyChordPotentiallyCharInput(in_stack_ffffffffffffffe0), bVar4)) {
          if ((pIVar2->DebugLogFlags & 0x80U) != 0) {
            pcVar7 = GetKeyChordName(g._4_4_);
            DebugLog("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> filtered as potential char input\n"
                     ,pcVar7,(ulong)local_c,(ulong)in_EDX);
          }
          return false;
        }
        if (((local_c & 0x8000) == 0) && ((pIVar2->ActiveIdUsingAllKeyboardKeys & 1U) != 0)) {
          local_1c = IVar5 & ~ImGuiMod_Mask_;
          if (local_1c == ImGuiKey_KeysData_OFFSET) {
            local_1c = ConvertSingleModFlagToKey(IVar5 & ImGuiMod_Mask_);
          }
          if ((0x1ff < (int)local_1c) && ((int)local_1c < 0x277)) {
            return false;
          }
        }
      }
      focus_scope_id_00 = pIVar2->CurrentFocusScopeId;
      if ((local_c & 0x20000) != 0) {
        focus_scope_id_00 = pIVar2->CurrentWindow->RootWindow->ID;
      }
      uVar6 = CalcRoutingScore(focus_scope_id_00,in_EDX,local_c);
      if ((pIVar2->DebugLogFlags & 0x80U) != 0) {
        pcVar7 = GetKeyChordName(g._4_4_);
        DebugLog("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> score %d\n",pcVar7,
                 (ulong)local_c,(ulong)in_EDX,(ulong)uVar6);
      }
      if (uVar6 == 0xff) {
        local_1 = false;
      }
      else {
        pIVar8 = GetShortcutRoutingData(routing_data._4_4_);
        if ((int)uVar6 < (int)(uint)pIVar8->RoutingNextScore) {
          pIVar8->RoutingNext = in_EDX;
          pIVar8->RoutingNextScore = (ImU8)uVar6;
        }
        if ((pIVar8->RoutingCurr == in_EDX) && ((pIVar2->DebugLogFlags & 0x80U) != 0)) {
          DebugLog("--> granting current route\n");
        }
        local_1 = pIVar8->RoutingCurr == in_EDX;
      }
    }
    else {
      if ((pIVar2->DebugLogFlags & 0x80U) != 0) {
        pcVar7 = GetKeyChordName(g._4_4_);
        DebugLog("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> always, no register\n",
                 pcVar7,(ulong)local_c,(ulong)in_EDX);
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord, ImGuiInputFlags flags, ImGuiID owner_id)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiInputFlags_RouteTypeMask_) == 0)
        flags |= ImGuiInputFlags_RouteGlobal | ImGuiInputFlags_RouteOverFocused | ImGuiInputFlags_RouteOverActive; // IMPORTANT: This is the default for SetShortcutRouting() but NOT Shortcut()
    else
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiInputFlags_RouteTypeMask_)); // Check that only 1 routing flag is used
    IM_ASSERT(owner_id != ImGuiKeyOwner_Any && owner_id != ImGuiKeyOwner_NoOwner);
    if (flags & (ImGuiInputFlags_RouteOverFocused | ImGuiInputFlags_RouteOverActive | ImGuiInputFlags_RouteUnlessBgFocused))
        IM_ASSERT(flags & ImGuiInputFlags_RouteGlobal);

    // Add ImGuiMod_XXXX when a corresponding ImGuiKey_LeftXXX/ImGuiKey_RightXXX is specified.
    key_chord = FixupKeyChord(key_chord);

    // [DEBUG] Debug break requested by user
    if (g.DebugBreakInShortcutRouting == key_chord)
        IM_DEBUG_BREAK();

    if (flags & ImGuiInputFlags_RouteUnlessBgFocused)
        if (g.NavWindow == NULL)
            return false;

    // Note how ImGuiInputFlags_RouteAlways won't set routing and thus won't set owner. May want to rework this?
    if (flags & ImGuiInputFlags_RouteAlways)
    {
        IMGUI_DEBUG_LOG_INPUTROUTING("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> always, no register\n", GetKeyChordName(key_chord), flags, owner_id);
        return true;
    }

    // Specific culling when there's an active item.
    if (g.ActiveId != 0 && g.ActiveId != owner_id)
    {
        if (flags & ImGuiInputFlags_RouteActive)
            return false;

        // Cull shortcuts with no modifiers when it could generate a character.
        // e.g. Shortcut(ImGuiKey_G) also generates 'g' character, should not trigger when InputText() is active.
        // but  Shortcut(Ctrl+G) should generally trigger when InputText() is active.
        // TL;DR: lettered shortcut with no mods or with only Alt mod will not trigger while an item reading text input is active.
        // (We cannot filter based on io.InputQueueCharacters[] contents because of trickling and key<>chars submission order are undefined)
        if (g.IO.WantTextInput && IsKeyChordPotentiallyCharInput(key_chord))
        {
            IMGUI_DEBUG_LOG_INPUTROUTING("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> filtered as potential char input\n", GetKeyChordName(key_chord), flags, owner_id);
            return false;
        }

        // ActiveIdUsingAllKeyboardKeys trumps all for ActiveId
        if ((flags & ImGuiInputFlags_RouteOverActive) == 0 && g.ActiveIdUsingAllKeyboardKeys)
        {
            ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
            if (key == ImGuiKey_None)
                key = ConvertSingleModFlagToKey((ImGuiKey)(key_chord & ImGuiMod_Mask_));
            if (key >= ImGuiKey_Keyboard_BEGIN && key < ImGuiKey_Keyboard_END)
                return false;
        }
    }

    // Where do we evaluate route for?
    ImGuiID focus_scope_id = g.CurrentFocusScopeId;
    if (flags & ImGuiInputFlags_RouteFromRootWindow)
        focus_scope_id = g.CurrentWindow->RootWindow->ID; // See PushFocusScope() call in Begin()

    const int score = CalcRoutingScore(focus_scope_id, owner_id, flags);
    IMGUI_DEBUG_LOG_INPUTROUTING("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> score %d\n", GetKeyChordName(key_chord), flags, owner_id, score);
    if (score == 255)
        return false;

    // Submit routing for NEXT frame (assuming score is sufficient)
    // FIXME: Could expose a way to use a "serve last" policy for same score resolution (using <= instead of <).
    ImGuiKeyRoutingData* routing_data = GetShortcutRoutingData(key_chord);
    //const bool set_route = (flags & ImGuiInputFlags_ServeLast) ? (score <= routing_data->RoutingNextScore) : (score < routing_data->RoutingNextScore);
    if (score < routing_data->RoutingNextScore)
    {
        routing_data->RoutingNext = owner_id;
        routing_data->RoutingNextScore = (ImU8)score;
    }

    // Return routing state for CURRENT frame
    if (routing_data->RoutingCurr == owner_id)
        IMGUI_DEBUG_LOG_INPUTROUTING("--> granting current route\n");
    return routing_data->RoutingCurr == owner_id;
}